

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  FileOptions *from_00;
  SourceCodeInfo *from_01;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(from->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(from->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(from->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(from->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(from->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::MergeFrom(&this->public_dependency_,&from->public_dependency_);
  RepeatedField<int>::MergeFrom(&this->weak_dependency_,&from->weak_dependency_);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_set_name(this,(from->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      _internal_set_package(this,(from->package_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      _internal_set_syntax(this,(from->syntax_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      this_00 = _internal_mutable_options(this);
      from_00 = (FileOptions *)_FileOptions_default_instance_;
      if (from->options_ != (FileOptions *)0x0) {
        from_00 = from->options_;
      }
      FileOptions::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 0x10) != 0) {
      this_01 = _internal_mutable_source_code_info(this);
      from_01 = (SourceCodeInfo *)_SourceCodeInfo_default_instance_;
      if (from->source_code_info_ != (SourceCodeInfo *)0x0) {
        from_01 = from->source_code_info_;
      }
      SourceCodeInfo::MergeFrom(this_01,from_01);
      return;
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  dependency_.MergeFrom(from.dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_package(from._internal_package());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_syntax(from._internal_syntax());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::FileOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_mutable_source_code_info()->PROTOBUF_NAMESPACE_ID::SourceCodeInfo::MergeFrom(from._internal_source_code_info());
    }
  }
}